

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprintint.h
# Opt level: O1

int print_uint64(uint64_t n,char *p)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  int iVar5;
  uint uVar6;
  uint64_t uVar7;
  char *pcVar8;
  bool bVar9;
  
  if (n < 1000000000) {
    iVar5 = print_uint32((uint32_t)n,p);
    return iVar5;
  }
  if (n >> 0xd < 0x48c27395) {
    if (n >> 0xb < 0x2e90edd) {
      bVar9 = n >> 10 < 0x9502f9;
      iVar5 = 10;
    }
    else {
      bVar9 = n >> 0xc < 0xe8d4a51;
      iVar5 = 0xc;
    }
    uVar6 = (iVar5 + 1) - (uint)bVar9;
  }
  else if (n < 10000000000000000) {
    uVar6 = 0x10;
    if (n < 1000000000000000) {
      uVar6 = 99999999999999 < n | 0xe;
    }
  }
  else if (n < 1000000000000000000) {
    uVar6 = (99999999999999999 < n) + 0x11;
  }
  else {
    uVar6 = (9999999999999999999 < n) + 0x13;
  }
  pcVar8 = p + uVar6;
  p[uVar6] = '\0';
  if ((uVar6 & 1) == 0) {
    uVar7 = n;
    switch(uVar6) {
    case 0x14:
      uVar7 = n / 100;
      *(undefined2 *)(pcVar8 + -2) =
           *(undefined2 *)
            (
            "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
            + (n % 100) * 2);
      pcVar8 = pcVar8 + -2;
    case 0x12:
      n = uVar7 / 100;
      *(undefined2 *)(pcVar8 + -2) =
           *(undefined2 *)
            (
            "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
            + (uVar7 % 100) * 2);
      pcVar8 = pcVar8 + -2;
    case 0x10:
      uVar7 = n / 100;
      *(undefined2 *)(pcVar8 + -2) =
           *(undefined2 *)
            (
            "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
            + (n % 100) * 2);
      pcVar8 = pcVar8 + -2;
    case 0xe:
      n = uVar7 / 100;
      *(undefined2 *)(pcVar8 + -2) =
           *(undefined2 *)
            (
            "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
            + (uVar7 % 100) * 2);
      pcVar8 = pcVar8 + -2;
    case 0xc:
      uVar7 = n / 100;
      *(undefined2 *)(pcVar8 + -2) =
           *(undefined2 *)
            (
            "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
            + (n % 100) * 2);
      pcVar8 = pcVar8 + -2;
    case 10:
      n = uVar7 / 100;
      *(undefined2 *)(pcVar8 + -2) =
           *(undefined2 *)
            (
            "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
            + (uVar7 % 100) * 2);
      pcVar8 = pcVar8 + -2;
    }
  }
  else {
    uVar7 = n;
    switch(uVar6) {
    case 0x13:
      uVar7 = n / 100;
      *(undefined2 *)(pcVar8 + -2) =
           *(undefined2 *)
            (
            "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
            + (n % 100) * 2);
      pcVar8 = pcVar8 + -2;
    case 0x11:
      n = uVar7 / 100;
      *(undefined2 *)(pcVar8 + -2) =
           *(undefined2 *)
            (
            "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
            + (uVar7 % 100) * 2);
      pcVar8 = pcVar8 + -2;
    case 0xf:
      uVar7 = n / 100;
      *(undefined2 *)(pcVar8 + -2) =
           *(undefined2 *)
            (
            "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
            + (n % 100) * 2);
      pcVar8 = pcVar8 + -2;
    case 0xd:
      n = uVar7 / 100;
      *(undefined2 *)(pcVar8 + -2) =
           *(undefined2 *)
            (
            "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
            + (uVar7 % 100) * 2);
      pcVar8 = pcVar8 + -2;
    case 0xb:
      *(undefined2 *)(pcVar8 + -2) =
           *(undefined2 *)
            (
            "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
            + (n % 100) * 2);
      auVar1._8_8_ = 0;
      auVar1._0_8_ = n / 100;
      pcVar8[-3] = (char)(n / 100) + SUB161(auVar1 * ZEXT816(0x199999999999999a),8) * -10 | 0x30;
      pcVar8 = pcVar8 + -3;
      n = n / 1000;
    }
  }
  *(undefined2 *)(pcVar8 + -2) =
       *(undefined2 *)
        (
        "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
        + (n % 100) * 2);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = n / 100;
  *(undefined2 *)(pcVar8 + -4) =
       *(undefined2 *)
        (
        "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
        + (ulong)((int)(n / 100) + (SUB164(auVar2 * ZEXT816(0x51eb851eb851eb9),8) >> 1) * -100) * 2)
  ;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = n / 10000;
  *(undefined2 *)(pcVar8 + -6) =
       *(undefined2 *)
        (
        "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
        + (ulong)(uint)((int)(n / 10000) + SUB164(auVar3 * ZEXT816(0x28f5c28f5c28f5d),8) * -100) * 2
        );
  auVar4._8_8_ = 0;
  auVar4._0_8_ = n / 1000000;
  *(undefined2 *)(pcVar8 + -8) =
       *(undefined2 *)
        (
        "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
        + (ulong)(uint)((int)(n / 1000000) + SUB164(auVar4 * ZEXT816(0x28f5c28f5c28f5d),8) * -100) *
          2);
  return uVar6;
}

Assistant:

static int print_uint64(uint64_t n, char *p)
{
    int k = 0;
    const char *dp;
    const uint64_t x = 1000000000ULL;

    if (n < x) {
        return print_uint32((uint32_t)n, p);
    }
    if(n >= 10000ULL * x) {
        if(n >= 10000000ULL * x) {
            if(n >= 1000000000ULL * x) {
                if (n >= 10000000000ULL * x) {
                    k = 11 + 9;
                } else {
                    k = 10 + 9;
                }
            } else if(n >= 100000000ULL * x) {
                k = 9 + 9;
            } else {
               k = 8 + 9;
            }
        } else {
            if(n >= 1000000ULL * x) {
                k = 7 + 9;
            } else if(n >= 100000ULL * x) {
                k = 6 + 9;
            } else {
                k = 5 + 9;
            }
        }
    } else {
        if(n >= 100ULL * x) {
            if(n >= 1000ULL * x) {
                k = 4 + 9;
            } else {
                k = 3 + 9;
            }
        } else {
            if(n >= 10ULL * x) {
                k = 2 + 9;
            } else {
                k = 1 + 9;
            }
        }
    }
    p += k;
    *p = '\0';
    if (k & 1) {
        switch (k) {
        case 19:
            __print_stage();
	    pattribute(fallthrough);
        case 17:
            __print_stage();
	    pattribute(fallthrough);
        case 15:
            __print_stage();
	    pattribute(fallthrough);
        case 13:
            __print_stage();
	    pattribute(fallthrough);
        case 11:
            __print_stage()
            __print_short_stage();
        }
    } else {
        switch (k) {
        case 20:
            __print_stage();
	    pattribute(fallthrough);
        case 18:
            __print_stage();
	    pattribute(fallthrough);
        case 16:
            __print_stage();
	    pattribute(fallthrough);
        case 14:
            __print_stage();
	    pattribute(fallthrough);
        case 12:
            __print_stage();
	    pattribute(fallthrough);
        case 10:
            __print_stage();
        }
    }
    __print_long_stage()
    __print_long_stage()
    return k;
}